

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void ppsum(double *u,int n,int l,double *sum)

{
  double local_38;
  double tmp2;
  double tmp1;
  int j;
  int i;
  double *sum_local;
  int l_local;
  int n_local;
  double *u_local;
  
  tmp2 = 0.0;
  for (tmp1._4_4_ = 1; tmp1._4_4_ <= l; tmp1._4_4_ = tmp1._4_4_ + 1) {
    local_38 = 0.0;
    for (tmp1._0_4_ = tmp1._4_4_; tmp1._0_4_ < n; tmp1._0_4_ = tmp1._0_4_ + 1) {
      local_38 = u[tmp1._0_4_] * u[tmp1._0_4_ - tmp1._4_4_] + local_38;
    }
    tmp2 = (1.0 - (double)tmp1._4_4_ / ((double)l + 1.0)) * local_38 + tmp2;
  }
  *sum = (tmp2 / (double)n) * 2.0 + *sum;
  return;
}

Assistant:

void ppsum(double* u, int n, int l, double* sum)
{
	/* Copyright (C) 1997-2000  Adrian Trapletti 
	efficient computation of the sums involved in the Phillips-Perron tests */
  int i, j;
  double tmp1, tmp2;

  //printf("%d %d %g \n ",n,l,*sum);
  
  tmp1 = 0.0;
  for (i=1; i<= l; i++)
  {
    tmp2 = 0.0;
    for (j=i; j< n; j++)  
    {
      tmp2 += (u[j]*u[j-i]);
    }
    tmp2 *= 1.0-((double)i/((double) l +1.0));
    tmp1 += tmp2;
  }
  tmp1 /= (double) n;
  tmp1 *= 2.0;
  (*sum) += tmp1;
}